

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

uint64_t aa64_dczid_read(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri)

{
  CPAccessResult CVar1;
  
  CVar1 = aa64_zva_access(env,ri,false);
  return (ulong)((uint)(CVar1 != CP_ACCESS_OK) << 4 | env[1].usr_regs[4]);
}

Assistant:

static uint64_t aa64_dczid_read(CPUARMState *env, const ARMCPRegInfo *ri)
{
    ARMCPU *cpu = env_archcpu(env);
    int dzp_bit = 1 << 4;

    /* DZP indicates whether DC ZVA access is allowed */
    if (aa64_zva_access(env, NULL, false) == CP_ACCESS_OK) {
        dzp_bit = 0;
    }
    return cpu->dcz_blocksize | dzp_bit;
}